

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Screen.cpp
# Opt level: O3

void __thiscall Screen::indicateMoreText(Screen *this)

{
  string formattedInput;
  char inputText [100];
  undefined1 local_78 [104];
  
  local_78[0] = 0;
  wclear(this->inputScreen);
  wrefresh(this->inputScreen);
  mvwprintw(this->inputScreen,1,1,"> ");
  wprintw(this->inputScreen,"[MORE TEXT, PRESS ENTER]");
  wgetnstr(this->inputScreen,local_78,0xffffffff);
  return;
}

Assistant:

void Screen::indicateMoreText() {
    std::string formattedInput;
    char inputText[MAX_INPUT_LENGTH];
    inputText[0] = '\0';

    // Clear the input area
    clearWindow(inputScreen);
    wrefresh(inputScreen);

    // Move the cursor to the correct location
    mvwprintw(inputScreen, 1, 1, "> ");
    wprintw(inputScreen, "[MORE TEXT, PRESS ENTER]");
    // Get a string of console input
    wgetstr(inputScreen, inputText);
}